

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O3

void __thiscall leveldb::CorruptionTest::RepairDB(CorruptionTest *this)

{
  Status local_1b0;
  Tester local_1a8;
  
  if (this->db_ != (DB *)0x0) {
    (*this->db_->_vptr_DB[1])();
  }
  this->db_ = (DB *)0x0;
  local_1a8.ok_ = true;
  local_1a8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1a8.line_ = 0x36;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8.ss_);
  leveldb::RepairDB((leveldb *)&local_1b0,&this->dbname_,&this->options_);
  test::Tester::IsOk(&local_1a8,&local_1b0);
  if (local_1b0.state_ != (char *)0x0) {
    operator_delete__(local_1b0.state_);
  }
  test::Tester::~Tester(&local_1a8);
  return;
}

Assistant:

void RepairDB() {
    delete db_;
    db_ = nullptr;
    ASSERT_OK(::leveldb::RepairDB(dbname_, options_));
  }